

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O0

void cftmdl(size_t n,size_t l,float *a,float *w)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  size_t sVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float x3i;
  float x3r;
  float x2i;
  float x2r;
  float x1i;
  float x1r;
  float x0i;
  float x0r;
  float wk3i;
  float wk3r;
  float wk2i;
  float wk2r;
  float wk1i;
  float wk1r;
  size_t m2;
  size_t m;
  size_t k2;
  size_t k1;
  size_t k;
  size_t j3;
  size_t j2;
  size_t j1;
  size_t j;
  float *w_local;
  float *a_local;
  size_t l_local;
  size_t n_local;
  
  for (j1 = 0; j1 < l; j1 = j1 + 2) {
    lVar17 = j1 + l;
    lVar18 = lVar17 + l;
    lVar19 = lVar18 + l;
    fVar1 = a[j1];
    fVar21 = a[lVar17];
    fVar22 = a[j1 + 1];
    fVar2 = a[lVar17 + 1];
    fVar23 = a[j1];
    fVar24 = a[lVar17];
    fVar25 = a[j1 + 1];
    fVar26 = a[lVar17 + 1];
    fVar3 = a[lVar18];
    fVar4 = a[lVar19];
    fVar5 = a[lVar18 + 1];
    fVar6 = a[lVar19 + 1];
    fVar7 = a[lVar18];
    fVar8 = a[lVar19];
    fVar9 = a[lVar18 + 1];
    fVar10 = a[lVar19 + 1];
    a[j1] = fVar1 + fVar21 + fVar3 + fVar4;
    a[j1 + 1] = fVar22 + fVar2 + fVar5 + fVar6;
    a[lVar18] = (fVar1 + fVar21) - (fVar3 + fVar4);
    a[lVar18 + 1] = (fVar22 + fVar2) - (fVar5 + fVar6);
    a[lVar17] = (fVar23 - fVar24) - (fVar9 - fVar10);
    a[lVar17 + 1] = (fVar25 - fVar26) + (fVar7 - fVar8);
    a[lVar19] = (fVar23 - fVar24) + (fVar9 - fVar10);
    a[lVar19 + 1] = (fVar25 - fVar26) - (fVar7 - fVar8);
  }
  fVar1 = w[2];
  for (j1 = l * 4; j1 < l * 5; j1 = j1 + 2) {
    lVar17 = j1 + l;
    lVar18 = lVar17 + l;
    lVar19 = lVar18 + l;
    fVar21 = a[j1];
    fVar22 = a[lVar17];
    fVar2 = a[j1 + 1];
    fVar23 = a[lVar17 + 1];
    fVar24 = a[j1];
    fVar25 = a[lVar17];
    fVar26 = a[j1 + 1];
    fVar3 = a[lVar17 + 1];
    fVar4 = a[lVar18];
    fVar5 = a[lVar19];
    fVar6 = a[lVar18 + 1];
    fVar7 = a[lVar19 + 1];
    fVar8 = a[lVar18];
    fVar9 = a[lVar19];
    fVar10 = a[lVar18 + 1];
    fVar11 = a[lVar19 + 1];
    a[j1] = fVar21 + fVar22 + fVar4 + fVar5;
    a[j1 + 1] = fVar2 + fVar23 + fVar6 + fVar7;
    a[lVar18] = (fVar6 + fVar7) - (fVar2 + fVar23);
    a[lVar18 + 1] = (fVar21 + fVar22) - (fVar4 + fVar5);
    fVar21 = (fVar24 - fVar25) - (fVar10 - fVar11);
    fVar22 = (fVar26 - fVar3) + (fVar8 - fVar9);
    a[lVar17] = fVar1 * (fVar21 - fVar22);
    a[lVar17 + 1] = fVar1 * (fVar21 + fVar22);
    fVar21 = (fVar10 - fVar11) + (fVar24 - fVar25);
    fVar22 = (fVar8 - fVar9) - (fVar26 - fVar3);
    a[lVar19] = fVar1 * (fVar22 - fVar21);
    a[lVar19 + 1] = fVar1 * (fVar22 + fVar21);
  }
  k2 = 0;
  for (k1 = l * 8; k1 < n; k1 = l * 8 + k1) {
    sVar20 = k2 + 2;
    fVar1 = w[sVar20];
    fVar21 = w[k2 + 3];
    fVar22 = w[sVar20 * 2];
    fVar2 = w[sVar20 * 2 + 1];
    fVar23 = -(fVar21 * 2.0) * fVar2 + fVar22;
    fVar24 = fVar21 * 2.0 * fVar22 + -fVar2;
    for (j1 = k1; j1 < l + k1; j1 = j1 + 2) {
      lVar17 = j1 + l;
      lVar18 = lVar17 + l;
      lVar19 = lVar18 + l;
      fVar25 = a[j1];
      fVar26 = a[lVar17];
      fVar3 = a[j1 + 1];
      fVar4 = a[lVar17 + 1];
      fVar5 = a[j1];
      fVar6 = a[lVar17];
      fVar7 = a[j1 + 1];
      fVar8 = a[lVar17 + 1];
      fVar9 = a[lVar18];
      fVar10 = a[lVar19];
      fVar11 = a[lVar18 + 1];
      fVar12 = a[lVar19 + 1];
      fVar13 = a[lVar18];
      fVar14 = a[lVar19];
      fVar15 = a[lVar18 + 1];
      fVar16 = a[lVar19 + 1];
      a[j1] = fVar25 + fVar26 + fVar9 + fVar10;
      a[j1 + 1] = fVar3 + fVar4 + fVar11 + fVar12;
      fVar25 = (fVar25 + fVar26) - (fVar9 + fVar10);
      fVar26 = (fVar3 + fVar4) - (fVar11 + fVar12);
      a[lVar18] = fVar1 * fVar25 + -(fVar21 * fVar26);
      a[lVar18 + 1] = fVar1 * fVar26 + fVar21 * fVar25;
      fVar25 = (fVar5 - fVar6) - (fVar15 - fVar16);
      fVar26 = (fVar7 - fVar8) + (fVar13 - fVar14);
      a[lVar17] = fVar22 * fVar25 + -(fVar2 * fVar26);
      a[lVar17 + 1] = fVar22 * fVar26 + fVar2 * fVar25;
      fVar25 = (fVar5 - fVar6) + (fVar15 - fVar16);
      fVar26 = (fVar7 - fVar8) - (fVar13 - fVar14);
      a[lVar19] = fVar23 * fVar25 + -(fVar24 * fVar26);
      a[lVar19 + 1] = fVar23 * fVar26 + fVar24 * fVar25;
    }
    fVar22 = w[sVar20 * 2 + 2];
    fVar2 = w[sVar20 * 2 + 3];
    fVar23 = -(fVar1 * 2.0) * fVar2 + fVar22;
    fVar24 = fVar1 * 2.0 * fVar22 + -fVar2;
    for (j1 = k1 + l * 4; j1 < k1 + l * 5; j1 = j1 + 2) {
      lVar17 = j1 + l;
      lVar18 = lVar17 + l;
      lVar19 = lVar18 + l;
      fVar25 = a[j1];
      fVar26 = a[lVar17];
      fVar3 = a[j1 + 1];
      fVar4 = a[lVar17 + 1];
      fVar5 = a[j1];
      fVar6 = a[lVar17];
      fVar7 = a[j1 + 1];
      fVar8 = a[lVar17 + 1];
      fVar9 = a[lVar18];
      fVar10 = a[lVar19];
      fVar11 = a[lVar18 + 1];
      fVar12 = a[lVar19 + 1];
      fVar13 = a[lVar18];
      fVar14 = a[lVar19];
      fVar15 = a[lVar18 + 1];
      fVar16 = a[lVar19 + 1];
      a[j1] = fVar25 + fVar26 + fVar9 + fVar10;
      a[j1 + 1] = fVar3 + fVar4 + fVar11 + fVar12;
      fVar25 = (fVar25 + fVar26) - (fVar9 + fVar10);
      fVar26 = (fVar3 + fVar4) - (fVar11 + fVar12);
      a[lVar18] = -fVar21 * fVar25 + -(fVar1 * fVar26);
      a[lVar18 + 1] = -fVar21 * fVar26 + fVar1 * fVar25;
      fVar25 = (fVar5 - fVar6) - (fVar15 - fVar16);
      fVar26 = (fVar7 - fVar8) + (fVar13 - fVar14);
      a[lVar17] = fVar22 * fVar25 + -(fVar2 * fVar26);
      a[lVar17 + 1] = fVar22 * fVar26 + fVar2 * fVar25;
      fVar25 = (fVar5 - fVar6) + (fVar15 - fVar16);
      fVar26 = (fVar7 - fVar8) - (fVar13 - fVar14);
      a[lVar19] = fVar23 * fVar25 + -(fVar24 * fVar26);
      a[lVar19 + 1] = fVar23 * fVar26 + fVar24 * fVar25;
    }
    k2 = sVar20;
  }
  return;
}

Assistant:

static void cftmdl(size_t n, size_t l, float *a, float *w)
{
    size_t j, j1, j2, j3, k, k1, k2, m, m2;
    float wk1r, wk1i, wk2r, wk2i, wk3r, wk3i;
    float x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;

    m = l << 2;
    for (j = 0; j < l; j += 2) {
        j1 = j + l;
        j2 = j1 + l;
        j3 = j2 + l;
        x0r = a[j] + a[j1];
        x0i = a[j + 1] + a[j1 + 1];
        x1r = a[j] - a[j1];
        x1i = a[j + 1] - a[j1 + 1];
        x2r = a[j2] + a[j3];
        x2i = a[j2 + 1] + a[j3 + 1];
        x3r = a[j2] - a[j3];
        x3i = a[j2 + 1] - a[j3 + 1];
        a[j] = x0r + x2r;
        a[j + 1] = x0i + x2i;
        a[j2] = x0r - x2r;
        a[j2 + 1] = x0i - x2i;
        a[j1] = x1r - x3i;
        a[j1 + 1] = x1i + x3r;
        a[j3] = x1r + x3i;
        a[j3 + 1] = x1i - x3r;
    }
    wk1r = w[2];
    for (j = m; j < l + m; j += 2) {
        j1 = j + l;
        j2 = j1 + l;
        j3 = j2 + l;
        x0r = a[j] + a[j1];
        x0i = a[j + 1] + a[j1 + 1];
        x1r = a[j] - a[j1];
        x1i = a[j + 1] - a[j1 + 1];
        x2r = a[j2] + a[j3];
        x2i = a[j2 + 1] + a[j3 + 1];
        x3r = a[j2] - a[j3];
        x3i = a[j2 + 1] - a[j3 + 1];
        a[j] = x0r + x2r;
        a[j + 1] = x0i + x2i;
        a[j2] = x2i - x0i;
        a[j2 + 1] = x0r - x2r;
        x0r = x1r - x3i;
        x0i = x1i + x3r;
        a[j1] = wk1r * (x0r - x0i);
        a[j1 + 1] = wk1r * (x0r + x0i);
        x0r = x3i + x1r;
        x0i = x3r - x1i;
        a[j3] = wk1r * (x0i - x0r);
        a[j3 + 1] = wk1r * (x0i + x0r);
    }
    k1 = 0;
    m2 = 2 * m;
    for (k = m2; k < n; k += m2) {
        k1 += 2;
        k2 = 2 * k1;
        wk2r = w[k1];
        wk2i = w[k1 + 1];
        wk1r = w[k2];
        wk1i = w[k2 + 1];
        wk3r = wk1r - 2 * wk2i * wk1i;
        wk3i = 2 * wk2i * wk1r - wk1i;
        for (j = k; j < l + k; j += 2) {
            j1 = j + l;
            j2 = j1 + l;
            j3 = j2 + l;
            x0r = a[j] + a[j1];
            x0i = a[j + 1] + a[j1 + 1];
            x1r = a[j] - a[j1];
            x1i = a[j + 1] - a[j1 + 1];
            x2r = a[j2] + a[j3];
            x2i = a[j2 + 1] + a[j3 + 1];
            x3r = a[j2] - a[j3];
            x3i = a[j2 + 1] - a[j3 + 1];
            a[j] = x0r + x2r;
            a[j + 1] = x0i + x2i;
            x0r -= x2r;
            x0i -= x2i;
            a[j2] = wk2r * x0r - wk2i * x0i;
            a[j2 + 1] = wk2r * x0i + wk2i * x0r;
            x0r = x1r - x3i;
            x0i = x1i + x3r;
            a[j1] = wk1r * x0r - wk1i * x0i;
            a[j1 + 1] = wk1r * x0i + wk1i * x0r;
            x0r = x1r + x3i;
            x0i = x1i - x3r;
            a[j3] = wk3r * x0r - wk3i * x0i;
            a[j3 + 1] = wk3r * x0i + wk3i * x0r;
        }
        wk1r = w[k2 + 2];
        wk1i = w[k2 + 3];
        wk3r = wk1r - 2 * wk2r * wk1i;
        wk3i = 2 * wk2r * wk1r - wk1i;
        for (j = k + m; j < l + (k + m); j += 2) {
            j1 = j + l;
            j2 = j1 + l;
            j3 = j2 + l;
            x0r = a[j] + a[j1];
            x0i = a[j + 1] + a[j1 + 1];
            x1r = a[j] - a[j1];
            x1i = a[j + 1] - a[j1 + 1];
            x2r = a[j2] + a[j3];
            x2i = a[j2 + 1] + a[j3 + 1];
            x3r = a[j2] - a[j3];
            x3i = a[j2 + 1] - a[j3 + 1];
            a[j] = x0r + x2r;
            a[j + 1] = x0i + x2i;
            x0r -= x2r;
            x0i -= x2i;
            a[j2] = -wk2i * x0r - wk2r * x0i;
            a[j2 + 1] = -wk2i * x0i + wk2r * x0r;
            x0r = x1r - x3i;
            x0i = x1i + x3r;
            a[j1] = wk1r * x0r - wk1i * x0i;
            a[j1 + 1] = wk1r * x0i + wk1i * x0r;
            x0r = x1r + x3i;
            x0i = x1i - x3r;
            a[j3] = wk3r * x0r - wk3i * x0i;
            a[j3 + 1] = wk3r * x0i + wk3i * x0r;
        }
    }
}